

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_tables.cpp
# Opt level: O2

void __thiscall
YAJLHuffmanTable::HFTree::HFTree(HFTree *this,YAJLHuffmanTable *table,bitio_stream *bstream)

{
  u8 *puVar1;
  ssize_t sVar2;
  HFNode *pHVar3;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  int i_2;
  byte bVar4;
  short sVar5;
  short sVar6;
  int i;
  long lVar7;
  int j;
  ulong uVar8;
  long lVar9;
  int i_1;
  u8 *var_codes [16];
  
  this->root = (HFNode *)0x0;
  *(undefined4 *)((long)&this->root + 7) = 0;
  if (table != (YAJLHuffmanTable *)0x0) {
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      bVar4 = table->ncodes[lVar7];
      puVar1 = (u8 *)operator_new__((ulong)bVar4);
      var_codes[lVar7] = puVar1;
      __buf = extraout_RDX;
      for (uVar8 = 0; uVar8 < bVar4; uVar8 = uVar8 + 1) {
        sVar2 = bitio::bitio_stream::read(bstream,8,__buf,in_RCX);
        puVar1[uVar8] = (u8)sVar2;
        bVar4 = table->ncodes[lVar7];
        __buf = extraout_RDX_00;
      }
    }
    pHVar3 = (HFNode *)operator_new(0x18);
    pHVar3->left = (HFNode *)0x0;
    pHVar3->right = (HFNode *)0x0;
    pHVar3->symbol = '\0';
    this->root = pHVar3;
    sVar5 = 0;
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      sVar6 = sVar5 * 2;
      for (lVar9 = 0; (uint)lVar9 < (uint)table->ncodes[lVar7]; lVar9 = lVar9 + 1) {
        insert(this,(short)lVar9 + sVar5,(u8)lVar7,var_codes[lVar7][lVar9]);
        sVar6 = sVar6 + 2;
      }
      sVar5 = sVar6;
    }
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      free(var_codes[lVar7]);
    }
  }
  return;
}

Assistant:

YAJLHuffmanTable::HFTree::HFTree(YAJLHuffmanTable *table, bitio::bitio_stream *bstream) {
    if (table == nullptr) {
        return;
    }



    auto ncodes = table->ncodes;
    u8 *var_codes[16];


    for (int i = 0; i < 16; i++) {
        var_codes[i] = new u8[ncodes[i]];
        for (int j = 0; j < ncodes[i]; j++) {
            var_codes[i][j] = bstream->read(0x8);
        }
    }

    u16 code = 0;
    u32 count = 0;
    root = new HFNode;

    // construct huffman-tree
    for (int i = 0; i < 16; i++) {
        auto in_count = 0;
        for (int j = 0; j < ncodes[i]; j++) {
            insert(code++, i, var_codes[i][in_count]);
            in_count++;
            count++;
        }
        code <<= 1;
    }

    for (int i = 0; i < 0x10; i++) {
        free(var_codes[i]);
    }
}